

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O0

int json_object_put(json_object *jso)

{
  json_type jVar1;
  uint32_t uVar2;
  json_object *jso_local;
  
  if (jso == (json_object *)0x0) {
    jso_local._4_4_ = 0;
  }
  else {
    if (jso->_ref_count == 0) {
      __assert_fail("jso->_ref_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/json-c[P]json-c/json_object.c"
                    ,0x118,"int json_object_put(struct json_object *)");
    }
    uVar2 = jso->_ref_count - 1;
    jso->_ref_count = uVar2;
    if (uVar2 == 0) {
      if (jso->_user_delete != (json_object_delete_fn *)0x0) {
        (*jso->_user_delete)(jso,jso->_userdata);
      }
      jVar1 = jso->o_type;
      if (jVar1 == json_type_object) {
        json_object_object_delete(jso);
      }
      else if (jVar1 == json_type_array) {
        json_object_array_delete(jso);
      }
      else if (jVar1 == json_type_string) {
        json_object_string_delete(jso);
      }
      else {
        json_object_generic_delete(jso);
      }
      jso_local._4_4_ = 1;
    }
    else {
      jso_local._4_4_ = 0;
    }
  }
  return jso_local._4_4_;
}

Assistant:

int json_object_put(struct json_object *jso)
{
	if (!jso)
		return 0;

	/* Avoid invalid free and crash explicitly instead of (silently)
	 * segfaulting.
	 */
	assert(jso->_ref_count > 0);

#if defined(HAVE_ATOMIC_BUILTINS) && defined(ENABLE_THREADING)
	/* Note: this only allow the refcount to remain correct
	 * when multiple threads are adjusting it.  It is still an error
	 * for a thread to decrement the refcount if it doesn't "own" it,
	 * as that can result in the thread that loses the race to 0
	 * operating on an already-freed object.
	 */
	if (__sync_sub_and_fetch(&jso->_ref_count, 1) > 0)
		return 0;
#else
	if (--jso->_ref_count > 0)
		return 0;
#endif

	if (jso->_user_delete)
		jso->_user_delete(jso, jso->_userdata);
	switch (jso->o_type)
	{
	case json_type_object: json_object_object_delete(jso); break;
	case json_type_array: json_object_array_delete(jso); break;
	case json_type_string: json_object_string_delete(jso); break;
	default: json_object_generic_delete(jso); break;
	}
	return 1;
}